

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_79cbb::ParserImpl::ParseFunctionBody(ParserImpl *this)

{
  int iVar1;
  Lexer *in_RAX;
  TokenDetail *pTVar2;
  GCObject *pGVar3;
  String *pSVar4;
  Lexer *pLVar5;
  ParseException *pPVar6;
  pointer *__ptr;
  ParserImpl *in_RSI;
  undefined1 uVar7;
  Lexer *local_38;
  
  local_38 = in_RAX;
  pTVar2 = LookAhead(in_RSI);
  iVar1 = pTVar2->line_;
  pTVar2 = NextToken(in_RSI);
  if (pTVar2->token_ != 0x28) {
    pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (pPVar6,"unexpect token after \'function\', expect \'(\'",&in_RSI->current_);
LAB_0016080e:
    __cxa_throw(pPVar6,&luna::ParseException::typeinfo,luna::Exception::~Exception);
  }
  pTVar2 = LookAhead(in_RSI);
  if (pTVar2->token_ == 0x29) {
    pSVar4 = (String *)0x0;
  }
  else {
    pTVar2 = LookAhead(in_RSI);
    if (pTVar2->token_ == 0x115) {
      pGVar3 = (GCObject *)operator_new(0x20);
      pGVar3->_vptr_GCObject = (_func_int **)&PTR__NameList_001993a8;
      pGVar3->next_ = (GCObject *)0x0;
      *(undefined8 *)&pGVar3->field_0x10 = 0;
      pGVar3[1]._vptr_GCObject = (_func_int **)0x0;
      pTVar2 = NextToken(in_RSI);
      std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::push_back
                ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)&pGVar3->next_,
                 pTVar2);
      while( true ) {
        pTVar2 = LookAhead(in_RSI);
        if (pTVar2->token_ != 0x2c) break;
        NextToken(in_RSI);
        pTVar2 = LookAhead(in_RSI);
        if (pTVar2->token_ != 0x115) {
          pTVar2 = LookAhead(in_RSI);
          if (pTVar2->token_ != 0x11d) {
            pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException
                      (pPVar6,"unexpect token in param list",&in_RSI->look_ahead_);
            __cxa_throw(pPVar6,&luna::ParseException::typeinfo,luna::Exception::~Exception);
          }
          uVar7 = 1;
          NextToken(in_RSI);
          goto LAB_00160757;
        }
        pTVar2 = NextToken(in_RSI);
        std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::push_back
                  ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)&pGVar3->next_,
                   pTVar2);
      }
      uVar7 = 0;
    }
    else {
      pTVar2 = LookAhead(in_RSI);
      if (pTVar2->token_ != 0x11d) {
        pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (pPVar6,"unexpect token in param list",&in_RSI->look_ahead_);
        goto LAB_0016080e;
      }
      NextToken(in_RSI);
      uVar7 = 1;
      pGVar3 = (GCObject *)0x0;
    }
LAB_00160757:
    pSVar4 = (String *)operator_new(0x20);
    (pSVar4->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__ParamList_00199368;
    (pSVar4->super_GCObject).next_ = pGVar3;
    (pSVar4->super_GCObject).field_0x10 = uVar7;
    (pSVar4->field_1).str_ = (char *)0x0;
  }
  pTVar2 = NextToken(in_RSI);
  if (pTVar2->token_ != 0x29) {
    pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (pPVar6,"unexpect token after param list, expect \')\'",&in_RSI->current_);
    __cxa_throw(pPVar6,&luna::ParseException::typeinfo,luna::Exception::~Exception);
  }
  ParseBlock((ParserImpl *)&stack0xffffffffffffffc8);
  pTVar2 = NextToken(in_RSI);
  if (pTVar2->token_ == 0x105) {
    pLVar5 = (Lexer *)operator_new(0x20);
    pLVar5->state_ = (State *)&PTR__FunctionBody_00199328;
    pLVar5->module_ = pSVar4;
    *(Lexer **)&(pLVar5->in_stream_).super__Function_base._M_functor = local_38;
    (pLVar5->in_stream_).super__Function_base._M_functor._M_pod_data[8] = '\0';
    *(int *)((long)&(pLVar5->in_stream_).super__Function_base._M_functor + 0xc) = iVar1;
    this->lexer_ = pLVar5;
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           this;
  }
  pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
  luna::ParseException::ParseException
            (pPVar6,"unexpect token after function body, expect \'end\'",&in_RSI->current_);
  __cxa_throw(pPVar6,&luna::ParseException::typeinfo,luna::Exception::~Exception);
}

Assistant:

std::unique_ptr<SyntaxTree> ParseFunctionBody()
        {
            int line = LookAhead().line_;
            if (NextToken().token_ != '(')
                throw ParseException("unexpect token after 'function', expect '('", current_);

            std::unique_ptr<SyntaxTree> param_list;

            if (LookAhead().token_ != ')')
                param_list = ParseParamList();

            if (NextToken().token_ != ')')
                throw ParseException("unexpect token after param list, expect ')'", current_);

            std::unique_ptr<SyntaxTree> block = ParseBlock();

            if (NextToken().token_ != Token_End)
                throw ParseException("unexpect token after function body, expect 'end'", current_);

            return std::unique_ptr<SyntaxTree>(new FunctionBody(std::move(param_list),
                                                                std::move(block), line));
        }